

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,VaryingExceedingComponentsTest *this,
          GLuint test_case_index,STAGES stage)

{
  size_t sVar1;
  reference pvVar2;
  GLchar *text;
  TestError *pTVar3;
  GLchar *local_90;
  GLchar *var_use;
  GLchar *type_name;
  size_t temp;
  size_t position;
  GLchar *index;
  GLchar *direction;
  GLchar *var_definition;
  GLchar buffer [16];
  GLchar *array;
  testCase *test_case;
  STAGES stage_local;
  GLuint test_case_index_local;
  VaryingExceedingComponentsTest *this_local;
  string *source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar2 = std::
           vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  if (pvVar2->m_stage == stage) {
    buffer._8_8_ = anon_var_dwarf_3d91;
    direction = (GLchar *)0x0;
    index = "in ";
    position = (size_t)anon_var_dwarf_3d91;
    temp = 0;
    text = Utils::Type::GetGLSLTypeName(&pvVar2->m_type);
    if ((pvVar2->m_is_input & 1U) == 0) {
      index = "out";
      if ((pvVar2->m_is_array & 1U) == 0) {
        direction = getShaderSource::var_definition_one;
        local_90 = getShaderSource::output_use_one;
      }
      else {
        direction = getShaderSource::var_definition_arr;
        local_90 = getShaderSource::output_use_arr;
      }
    }
    else if ((pvVar2->m_is_array & 1U) == 0) {
      direction = getShaderSource::var_definition_one;
      local_90 = getShaderSource::input_use_one;
    }
    else {
      direction = getShaderSource::var_definition_arr;
      local_90 = getShaderSource::input_use_arr;
    }
    sprintf((char *)&var_definition,"%d",(ulong)pvVar2->m_component);
    switch(stage) {
    case VERTEX:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs_tested);
      break;
    case TESS_CTRL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      position = (long)"VARIABLE_NAME[gl_InvocationID]" + 0xd;
      break;
    case TESS_EVAL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tes_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      position = (long)"ac_counter67[0]" + 0xc;
      break;
    case GEOMETRY:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::gs_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      position = (long)"ac_counter67[0]" + 0xc;
      break;
    case FRAGMENT:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs_tested);
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x3c31);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    sVar1 = temp;
    Utils::replaceToken("VAR_DEFINITION",&temp,direction,__return_storage_ptr__);
    temp = sVar1;
    Utils::replaceToken("COMPONENT",&temp,(GLchar *)&var_definition,__return_storage_ptr__);
    Utils::replaceToken("DIRECTION",&temp,index,__return_storage_ptr__);
    Utils::replaceToken("ARRAY",&temp,(GLchar *)buffer._8_8_,__return_storage_ptr__);
    Utils::replaceToken("VARIABLE_USE",&temp,local_90,__return_storage_ptr__);
    Utils::replaceAllTokens("TYPE",text,__return_storage_ptr__);
    Utils::replaceAllTokens("INDEX",(GLchar *)position,__return_storage_ptr__);
  }
  else {
    switch(stage) {
    case VERTEX:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      break;
    case TESS_CTRL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs);
      break;
    case TESS_EVAL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tes);
      break;
    case GEOMETRY:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::gs);
      break;
    case FRAGMENT:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x3c53);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingExceedingComponentsTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* var_definition_arr =
		"layout (location = 1, component = COMPONENT) flat DIRECTION TYPE gokuARRAY[1];\n";
	static const GLchar* var_definition_one =
		"layout (location = 1, component = COMPONENT) flat DIRECTION TYPE gokuARRAY;\n";
	static const GLchar* input_use_arr = "    if (TYPE(0) == gokuINDEX[0])\n"
										 "    {\n"
										 "        result += vec4(1, 0.5, 0.25, 0.125);\n"
										 "    }\n";
	static const GLchar* input_use_one = "    if (TYPE(0) == gokuINDEX)\n"
										 "    {\n"
										 "        result += vec4(1, 0.5, 0.25, 0.125);\n"
										 "    }\n";
	static const GLchar* output_use_arr = "    gokuINDEX[0] = TYPE(0);\n"
										  "    if (vec4(0) == result)\n"
										  "    {\n"
										  "        gokuINDEX[0] = TYPE(1);\n"
										  "    }\n";
	static const GLchar* output_use_one = "    gokuINDEX = TYPE(0);\n"
										  "    if (vec4(0) == result)\n"
										  "    {\n"
										  "        gokuINDEX = TYPE(1);\n"
										  "    }\n";
	static const GLchar* fs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* fs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 gs_fs;\n"
									 "out vec4 fs_out;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = gs_fs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    fs_out += result;\n"
									 "}\n"
									 "\n";
	static const GLchar* gs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "layout(points)                           in;\n"
							  "layout(triangle_strip, max_vertices = 4) out;\n"
							  "\n"
							  "in  vec4 tes_gs[];\n"
							  "out vec4 gs_fs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(1, -1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "    gs_fs = tes_gs[0];\n"
							  "    gl_Position  = vec4(1, 1, 0, 1);\n"
							  "    EmitVertex();\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(isolines, point_mode) in;\n"
							   "\n"
							   "in  vec4 tcs_tes[];\n"
							   "out vec4 tes_gs;\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    tes_gs = tcs_tes[0];\n"
							   "}\n"
							   "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs += result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar* array = "";
		GLchar		  buffer[16];
		const GLchar* var_definition = 0;
		const GLchar* direction		 = "in ";
		const GLchar* index			 = "";
		size_t		  position		 = 0;
		size_t		  temp;
		const GLchar* type_name = test_case.m_type.GetGLSLTypeName();
		const GLchar* var_use   = 0;

		if (false == test_case.m_is_input)
		{
			direction = "out";

			if (false == test_case.m_is_array)
			{
				var_definition = var_definition_one;
				var_use		   = output_use_one;
			}
			else
			{
				var_definition = var_definition_arr;
				var_use		   = output_use_arr;
			}
		}
		else
		{
			if (false == test_case.m_is_array)
			{
				var_definition = var_definition_one;
				var_use		   = input_use_one;
			}
			else
			{
				var_definition = var_definition_arr;
				var_use		   = input_use_arr;
			}
		}

		sprintf(buffer, "%d", test_case.m_component);

		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			source = fs_tested;
			break;
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("COMPONENT", position, buffer, source);
		Utils::replaceToken("DIRECTION", position, direction, source);
		Utils::replaceToken("ARRAY", position, array, source);
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("TYPE", type_name, source);
		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			source = fs;
			break;
		case Utils::Shader::GEOMETRY:
			source = gs;
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs;
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes;
			break;
		case Utils::Shader::VERTEX:
			source = vs;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}

	return source;
}